

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# h265e_slice.c
# Opt level: O3

void h265e_slice_init(void *ctx,EncFrmStatus curr)

{
  uint uVar1;
  long lVar2;
  uint *__s;
  uint uVar3;
  long lVar4;
  
  lVar2 = *ctx;
  __s = *(uint **)(*(long *)(*(long *)((long)ctx + 0x5008) + 0x378) + 0x40);
  *(uint **)((long)ctx + 0x5000) = __s;
  if ((h265e_debug & 1) != 0) {
    _mpp_log_l(4,"h265e_slice","enter\n","h265e_slice_init");
  }
  memset(__s,0,0x700);
  *(long *)(__s + 0x1a0) = (long)ctx + 0x1640;
  *(long *)(__s + 0x1a4) = (long)ctx + 0x10;
  *(uint **)(__s + 0x1a2) = (uint *)((long)ctx + 0x4ce0);
  __s[0x111] = 0;
  __s[0x112] = 0;
  __s[0x1a6] = 1;
  __s[0x115] = 0;
  __s[0x1a8] = 5;
  __s[0x1b2] = 0;
  __s[0x1b7] = *(uint *)((long)ctx + 0x169c);
  __s[3] = 1;
  lVar4 = *(long *)(*(long *)((long)ctx + 0x5008) + 0x378);
  *(undefined4 *)(lVar4 + 0x58) = 0;
  if ((curr.val & 0x20) == 0) {
    __s[0x107] = 1;
    *(byte *)(lVar4 + 0x20) = *(byte *)(lVar4 + 0x20) & 0xef;
    lVar4 = *(long *)((long)ctx + 0x5008);
  }
  else {
    __s[0x107] = 2;
    *(undefined4 *)(lVar4 + 0x58) = 1;
    *(byte *)(lVar4 + 0x20) = *(byte *)(lVar4 + 0x20) | 0x10;
    lVar4 = *(long *)((long)ctx + 0x5008);
    *(undefined4 *)(lVar4 + 4) = 0;
  }
  *(EncFrmStatus *)(*(long *)(lVar4 + 0x378) + 0x20) = curr;
  if ((curr.val & 2) == 0 && __s[0x107] != 0) {
    __s[0x19e] = 1;
  }
  if (*(int *)(*(long *)(__s + 0x1a2) + 0x300) == 0) {
    __s[0x10c] = *(uint *)((long)ctx + 0x4fe4);
    *(undefined8 *)(__s + 0x10e) = *(undefined8 *)((long)ctx + 0x4fe8);
  }
  else if ((h265e_debug & 0x100) != 0) {
    _mpp_log_l(4,"h265e_slice","to do in this case",(char *)0x0);
  }
  *__s = (uint)(*(int *)(lVar2 + 0x42c) == 0);
  uVar3 = 0;
  if (*(int *)(lVar2 + 0x24) != 0xc) {
    uVar3 = (uint)(*(int *)(lVar2 + 0x430) == 0);
  }
  __s[1] = uVar3;
  __s[0x1a8] = *(uint *)(lVar2 + 0x448);
  __s[0x1b2] = *(uint *)(lVar2 + 0x410);
  __s[3] = 1;
  __s[2] = *(uint *)((long)ctx + 0x4ce0);
  if (*(int *)(*(long *)(__s + 0x1a2) + 0x14) != 0) {
    *(undefined8 *)(__s + 0x114) = *(undefined8 *)(lVar2 + 0x420);
  }
  lVar2 = *(long *)((long)ctx + 0x5008);
  lVar4 = *(long *)(lVar2 + 0x378);
  uVar3 = *(uint *)(lVar4 + 0xc);
  __s[4] = uVar3;
  uVar1 = *(uint *)(lVar2 + 4);
  __s[5] = uVar1;
  __s[0x108] = *(uint *)(lVar4 + 0x20) >> 0xc & 0xf;
  *(uint *)(lVar2 + 4) = uVar1 + 1;
  *(uint *)(lVar4 + 0x10) = uVar1;
  *(uint *)(lVar4 + 0x3c) = uVar3;
  if ((char)curr.val < '\0') {
    *(undefined4 *)(lVar4 + 0x30) = 1;
  }
  if ((h265e_debug >> 8 & 1) != 0) {
    _mpp_log_l(4,"h265e_slice","slice->m_sliceType = %d slice->is_referenced = %d \n",(char *)0x0,
               (ulong)__s[0x107],(ulong)__s[0x19e]);
  }
  if ((h265e_debug & 1) == 0) {
    return;
  }
  _mpp_log_l(4,"h265e_slice","leave\n","h265e_slice_init");
  return;
}

Assistant:

void h265e_slice_init(void *ctx, EncFrmStatus curr)
{
    H265eCtx *p = (H265eCtx *)ctx;
    H265eVps *vps = &p->vps;
    H265eSps *sps = &p->sps;
    H265ePps *pps = &p->pps;
    MppEncCfgSet *cfg = p->cfg;
    MppEncH265Cfg *codec = &cfg->codec.h265;
    MppEncPrepCfg *prep_cfg = &cfg->prep;
    H265eSlice *slice = p->dpb->curr->slice;
    p->slice = p->dpb->curr->slice;
    h265e_dbg_func("enter\n");
    memset(slice, 0, sizeof(H265eSlice));
    slice->m_sps = sps;
    slice->m_vps = vps;
    slice->m_pps = pps;
    slice->m_numRefIdx[0] = 0;
    slice->m_numRefIdx[1] = 0;
    slice->m_colFromL0Flag = 1;
    slice->m_colRefIdx = 0;
    slice->m_bCheckLDC = 0;
    slice->m_sliceQpDeltaCb = 0;
    slice->m_sliceQpDeltaCr = 0;
    slice->m_maxNumMergeCand = 5;
    slice->m_bFinalized = 0;

    slice->m_cabacInitFlag = 0;
    slice->m_numEntryPointOffsets = 0;
    slice->m_enableTMVPFlag = sps->m_TMVPFlagsPresent;
    slice->m_picOutputFlag = 1;
    p->dpb->curr->is_key_frame = 0;
    if (curr.is_idr) {
        slice->m_sliceType = I_SLICE;
        p->dpb->curr->is_key_frame = 1;
        p->dpb->curr->status.is_intra = 1;
        p->dpb->gop_idx = 0;
    } else {
        slice->m_sliceType = P_SLICE;
        p->dpb->curr->status.is_intra = 0;
    }

    p->dpb->curr->status.val = curr.val;

    if (slice->m_sliceType  != B_SLICE && !curr.non_recn)
        slice->is_referenced = 1;

    if (slice->m_pps->m_deblockingFilterOverrideEnabledFlag) {
        h265e_dbg_slice("to do in this case");
    } else {
        slice->m_deblockingFilterDisable = pps->m_picDisableDeblockingFilterFlag;
        slice->m_deblockingFilterBetaOffsetDiv2 = pps->m_deblockingFilterBetaOffsetDiv2;
        slice->m_deblockingFilterTcOffsetDiv2 = pps->m_deblockingFilterTcOffsetDiv2;
    }
    slice->m_saoEnabledFlag = !codec->sao_cfg.slice_sao_luma_disable;
    slice->m_saoEnabledFlagChroma = (prep_cfg->format == MPP_FMT_YUV400) ?  0 :
                                    !codec->sao_cfg.slice_sao_chroma_disable;
    slice->m_maxNumMergeCand = codec->merge_cfg.max_mrg_cnd;
    slice->m_cabacInitFlag = codec->entropy_cfg.cabac_init_flag;
    slice->m_picOutputFlag = 1;
    slice->m_ppsId = pps->m_PPSId;
    if (slice->m_pps->m_bSliceChromaQpFlag) {
        slice->m_sliceQpDeltaCb = codec->trans_cfg.cb_qp_offset;
        slice->m_sliceQpDeltaCr = codec->trans_cfg.cr_qp_offset;
    }

    slice->poc = p->dpb->curr->seq_idx;
    slice->gop_idx = p->dpb->gop_idx;
    slice->temporal_id = p->dpb->curr->status.temporal_id;
    p->dpb->curr->gop_idx =  p->dpb->gop_idx++;
    p->dpb->curr->poc = slice->poc;
    if (curr.is_lt_ref)
        p->dpb->curr->is_long_term = 1;

    h265e_dbg_slice("slice->m_sliceType = %d slice->is_referenced = %d \n",
                    slice->m_sliceType, slice->is_referenced);
    h265e_dbg_func("leave\n");
}